

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetCompileOptions
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language)

{
  cmMakefile *this_00;
  bool bVar1;
  bool local_1d9;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  EvaluatedTargetPropertyEntries entries;
  undefined1 local_158 [6];
  bool debugOptions;
  undefined1 local_138 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueOptions;
  string *language_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *result;
  
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dagChecker.CheckResult);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"COMPILE_OPTIONS",&local_109);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_e8,this,&local_108,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_138);
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_158,"CMAKE_DEBUG_TARGET_PROPERTIES",
             (allocator<char> *)&entries.field_0x1f);
  cmMakefile::GetDefExpandList
            (this_00,(string *)local_158,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_138,false);
  std::__cxx11::string::~string((string *)local_158);
  std::allocator<char>::~allocator((allocator<char> *)&entries.field_0x1f);
  local_1d9 = false;
  if ((this->DebugCompileOptionsDone & 1U) == 0) {
    local_1d9 = ::cm::
                contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[16],_0>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_138,(char (*) [16])0xc84ff4);
  }
  entries._30_1_ = local_1d9;
  bVar1 = cmGlobalGenerator::GetConfigureDoneCMP0026(this->GlobalGenerator);
  if (bVar1) {
    this->DebugCompileOptionsDone = true;
  }
  anon_unknown.dwarf_f8fb87::EvaluateTargetPropertyEntries
            ((EvaluatedTargetPropertyEntries *)local_180,this,config,language,
             (cmGeneratorExpressionDAGChecker *)local_e8,&this->CompileOptionsEntries);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"INTERFACE_COMPILE_OPTIONS",&local_1a1);
  anon_unknown.dwarf_f8fb87::AddInterfaceEntries
            (this,config,&local_1a0,language,(cmGeneratorExpressionDAGChecker *)local_e8,
             (EvaluatedTargetPropertyEntries *)local_180,Yes,Usage);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  anon_unknown.dwarf_f8fb87::processOptions
            (this,(EvaluatedTargetPropertyEntries *)local_180,__return_storage_ptr__,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&dagChecker.CheckResult,(bool)(entries._30_1_ & 1),"compile options",Shell,false);
  anon_unknown.dwarf_f8fb87::EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
            ((EvaluatedTargetPropertyEntries *)local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_e8);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&dagChecker.CheckResult);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetCompileOptions(
  std::string const& config, std::string const& language) const
{
  std::vector<BT<std::string>> result;
  std::unordered_set<std::string> uniqueOptions;

  cmGeneratorExpressionDAGChecker dagChecker(this, "COMPILE_OPTIONS", nullptr,
                                             nullptr);

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugOptions = !this->DebugCompileOptionsDone &&
    cm::contains(debugProperties, "COMPILE_OPTIONS");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugCompileOptionsDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, language, &dagChecker, this->CompileOptionsEntries);

  AddInterfaceEntries(this, config, "INTERFACE_COMPILE_OPTIONS", language,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes);

  processOptions(this, entries, result, uniqueOptions, debugOptions,
                 "compile options", OptionsParse::Shell);

  return result;
}